

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_common.cpp
# Opt level: O2

uint dxil_spv::get_type_scalar_alignment(Impl *impl,Type *type)

{
  TypeID TVar1;
  uint uVar2;
  LoggingCallback p_Var3;
  void *pvVar4;
  TypeID TVar5;
  char buffer [4096];
  
  TVar1 = LLVMBC::Type::getTypeID(type);
  switch(TVar1) {
  case HalfTyID:
    break;
  case FloatTyID:
    TVar1 = DoubleTyID;
    break;
  case DoubleTyID:
    TVar1 = StructTyID;
    break;
  case IntegerTyID:
    uVar2 = LLVMBC::Type::getIntegerBitWidth(type);
    TVar1 = uVar2 >> 3;
    break;
  default:
    p_Var3 = get_thread_log_callback();
    if (p_Var3 == (LoggingCallback)0x0) {
      fwrite("[ERROR]: Invalid type for scalar alignment query.\n",0x32,1,_stderr);
      fflush(_stderr);
    }
    else {
      builtin_strncpy(buffer + 0x20,"t query.\n",10);
      builtin_strncpy(buffer + 0x10," scalar alignmen",0x10);
      builtin_strncpy(buffer,"Invalid type for",0x10);
      pvVar4 = get_thread_log_callback_userdata();
      (*p_Var3)(pvVar4,Error,buffer);
    }
    return 1;
  }
  TVar5 = DoubleTyID;
  if ((impl->execution_mode_meta).native_16bit_operations != false) {
    TVar5 = TVar1;
  }
  if (TVar1 != HalfTyID) {
    TVar5 = TVar1;
  }
  return TVar5;
}

Assistant:

unsigned get_type_scalar_alignment(Converter::Impl &impl, const llvm::Type *type)
{
	unsigned scalar_alignment;
	switch (type->getTypeID())
	{
	case llvm::Type::TypeID::IntegerTyID:
		scalar_alignment = type->getIntegerBitWidth() / 8;
		break;
	case llvm::Type::TypeID::HalfTyID:
		scalar_alignment = 2;
		break;
	case llvm::Type::TypeID::FloatTyID:
		scalar_alignment = 4;
		break;
	case llvm::Type::TypeID::DoubleTyID:
		scalar_alignment = 8;
		break;
	default:
		LOGE("Invalid type for scalar alignment query.\n");
		return 1;
	}

	if (!impl.execution_mode_meta.native_16bit_operations && scalar_alignment == 2)
		scalar_alignment = 4;

	return scalar_alignment;
}